

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O0

long __thiscall gl4cts::BasicUsageSimple::Run(BasicUsageSimple *this)

{
  GLuint GVar1;
  Vector<float,_4> local_38;
  undefined4 *local_28;
  uint *ptr;
  char *src_fs;
  char *src_vs;
  BasicUsageSimple *this_local;
  
  src_fs = 
  "#version 420 core\nlayout(location = 0) in vec4 i_vertex;\nvoid main() {\n  gl_Position = i_vertex;\n}"
  ;
  ptr = (uint *)anon_var_dwarf_15e6d6;
  src_vs = (char *)this;
  GVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CreateProgram
                    (&this->super_SACSubcaseBase,
                     "#version 420 core\nlayout(location = 0) in vec4 i_vertex;\nvoid main() {\n  gl_Position = i_vertex;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,
                     "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(binding = 0, offset = 0) uniform atomic_uint ac_counter;\nvoid main() {\n  uint c = atomicCounterIncrement(ac_counter);\n  float r = float(c / 40u) / 255.0;\n  o_color = vec4(r, 0.0, 0.0, 1.0);\n}"
                     ,true);
  this->prog_ = GVar1;
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->counter_buffer_);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92c0,this->counter_buffer_);
  glu::CallLogWrapper::glBufferData
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92c0,4,(void *)0x0,0x88ea);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92c0,0);
  gl4cts::anon_unknown_0::SACSubcaseBase::CreateQuad
            (&this->super_SACSubcaseBase,&this->vao_,&this->vbo_,(GLuint *)0x0);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92c0,this->counter_buffer_);
  local_28 = (undefined4 *)
             glu::CallLogWrapper::glMapBufferRange
                       (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                         super_CallLogWrapper,0x92c0,0,4,10);
  *local_28 = 0;
  glu::CallLogWrapper::glUnmapBuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92c0);
  glu::CallLogWrapper::glBindBufferBase
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92c0,0,this->counter_buffer_);
  glu::CallLogWrapper::glUseProgram
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             this->prog_);
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             this->vao_);
  glu::CallLogWrapper::glDrawArrays
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,5,
             0,4);
  tcu::Vector<float,_4>::Vector(&local_38,1.0,0.0,0.0,1.0);
  gl4cts::anon_unknown_0::SACSubcaseBase::ValidateReadBuffer(&this->super_SACSubcaseBase,&local_38);
  return 0;
}

Assistant:

virtual long Run()
	{
		// create program
		const char* src_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_vertex;" NL "void main() {" NL
							 "  gl_Position = i_vertex;" NL "}";
		const char* src_fs = "#version 420 core" NL "layout(location = 0) out vec4 o_color;" NL
							 "layout(binding = 0, offset = 0) uniform atomic_uint ac_counter;" NL "void main() {" NL
							 "  uint c = atomicCounterIncrement(ac_counter);" NL
							 "  float r = float(c / 40u) / 255.0;" NL "  o_color = vec4(r, 0.0, 0.0, 1.0);" NL "}";
		prog_ = CreateProgram(src_vs, NULL, NULL, NULL, src_fs, true);

		// create atomic counter buffer
		glGenBuffers(1, &counter_buffer_);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, 4, NULL, GL_DYNAMIC_COPY);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		// create geometry
		CreateQuad(&vao_, &vbo_, NULL);

		// clear counter buffer (set to 0)
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_);
		unsigned int* ptr = static_cast<unsigned int*>(
			glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, 4, GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_BUFFER_BIT));
		*ptr = 0;
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);

		// draw
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, counter_buffer_);
		glUseProgram(prog_);
		glBindVertexArray(vao_);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		ValidateReadBuffer(Vec4(1, 0, 0, 1));

		return NO_ERROR;
	}